

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O1

void test_readers_writers_with_handle_pool
               (int nhandles,int nfiles,int writers,int readers,bool useSnapHandlePool,int time)

{
  undefined8 *puVar1;
  char *pcVar2;
  StatAggregator *this;
  uint uVar3;
  long *plVar4;
  SnapHandlePool *pSVar5;
  pthread_t *ppVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong uVar9;
  size_type *psVar10;
  ulong *puVar11;
  int iVar12;
  undefined4 in_register_0000003c;
  uint __uval;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  string __str;
  string test_title;
  string __str_3;
  string __str_2;
  ops_args oa;
  string __str_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string __str_1;
  timeval __test_begin;
  char *local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  value_type local_200;
  pthread_t *local_1e0;
  undefined8 local_1d8;
  uint local_1d0;
  int local_1cc;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  ulong *local_1a8;
  long local_1a0;
  ulong local_198 [2];
  ulong *local_188;
  long local_180;
  ulong local_178;
  long lStack_170;
  SnapHandlePool *local_168;
  float local_160;
  undefined1 local_15c;
  undefined8 *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108 [2];
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  SnapHandlePool *local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  timeval local_40;
  
  local_1d8 = CONCAT44(in_register_0000003c,nhandles);
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  usecase_test* > errorlog.txt");
  if (nfiles < 1) {
    fprintf(_stderr,"[ERROR] Invalid number of files: %d!",(ulong)(uint)nfiles);
    return;
  }
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = 1;
  local_1cc = time;
  do {
    uVar13 = 1;
    if (9 < uVar14) {
      uVar9 = (ulong)uVar14;
      uVar15 = 4;
      do {
        uVar13 = uVar15;
        uVar3 = (uint)uVar9;
        if (uVar3 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_001064e3;
        }
        if (uVar3 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_001064e3;
        }
        if (uVar3 < 10000) goto LAB_001064e3;
        uVar9 = uVar9 / 10000;
        uVar15 = uVar13 + 4;
      } while (99999 < uVar3);
      uVar13 = uVar13 + 1;
    }
LAB_001064e3:
    local_220 = (char *)&local_210;
    std::__cxx11::string::_M_construct((ulong)&local_220,(char)uVar13);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_220,uVar13,uVar14);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,0x1431af);
    psVar10 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_200.field_2._M_allocated_capacity = *psVar10;
      local_200.field_2._8_8_ = plVar4[3];
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    }
    else {
      local_200.field_2._M_allocated_capacity = *psVar10;
      local_200._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_200._M_string_length = plVar4[1];
    *plVar4 = (long)psVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_220 != (char *)&local_210) {
      operator_delete(local_220);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_b8,&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    bVar17 = uVar14 != nfiles;
    uVar14 = uVar14 + 1;
  } while (bVar17);
  uVar14 = readers + writers;
  if (uVar14 == 0 || SCARRY4(readers,writers) != (int)uVar14 < 0) {
    fprintf(_stderr,"[ERROR] Invalid number of readers (%d)/writers (%d)!",(ulong)(uint)readers);
    goto LAB_00106ef0;
  }
  if (useSnapHandlePool) {
    pSVar5 = (SnapHandlePool *)operator_new(0x98);
    this_00 = &local_70;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_00,&local_b8);
    SnapHandlePool::SnapHandlePool(pSVar5,this_00,(int)local_1d8);
  }
  else {
    pSVar5 = (SnapHandlePool *)operator_new(0x58);
    this_00 = &local_58;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_00,&local_b8);
    FileHandlePool::FileHandlePool((FileHandlePool *)pSVar5,this_00,(int)local_1d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  local_1d0 = uVar14;
  ppVar6 = (pthread_t *)operator_new__((ulong)uVar14 << 3);
  local_160 = (float)local_1cc;
  uVar9 = 0;
  local_1e0 = ppVar6;
  local_168 = pSVar5;
  local_15c = useSnapHandlePool;
  local_98 = pSVar5;
  if (0 < writers) {
    uVar9 = 0;
    do {
      uVar9 = uVar9 + 1;
      pthread_create(ppVar6,(pthread_attr_t *)0x0,invoke_writer_ops,&local_168);
      ppVar6 = ppVar6 + 1;
    } while ((uint)writers != uVar9);
  }
  uVar14 = (uint)uVar9;
  if (0 < readers) {
    ppVar6 = local_1e0 + (uVar9 & 0xffffffff);
    iVar12 = 0;
    do {
      pthread_create(ppVar6,(pthread_attr_t *)0x0,invoke_reader_ops,&local_168);
      ppVar6 = ppVar6 + 1;
      iVar12 = iVar12 + -1;
    } while (-readers != iVar12);
    uVar14 = uVar14 - iVar12;
  }
  ppVar6 = local_1e0;
  if (uVar14 != local_1d0) {
    __assert_fail("threadid == readers + writers",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                  ,0x288,"void test_readers_writers_with_handle_pool(int, int, int, int, bool, int)"
                 );
  }
  uVar9 = 1;
  if (1 < (int)local_1d0) {
    uVar9 = (ulong)local_1d0;
  }
  uVar16 = 0;
  do {
    iVar12 = pthread_join(ppVar6[uVar16],(void **)0x0);
    if (iVar12 != 0) {
      __assert_fail("r == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                    ,0x28d,
                    "void test_readers_writers_with_handle_pool(int, int, int, int, bool, int)");
    }
    uVar16 = uVar16 + 1;
  } while (uVar9 != uVar16);
  operator_delete__(ppVar6);
  uVar13 = (uint)local_1d8;
  uVar14 = -uVar13;
  if (0 < (int)uVar13) {
    uVar14 = uVar13;
  }
  uVar15 = 1;
  if (9 < uVar14) {
    uVar9 = (ulong)uVar14;
    uVar3 = 4;
    do {
      uVar15 = uVar3;
      uVar8 = (uint)uVar9;
      if (uVar8 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_001067dd;
      }
      if (uVar8 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_001067dd;
      }
      if (uVar8 < 10000) goto LAB_001067dd;
      uVar9 = uVar9 / 10000;
      uVar3 = uVar15 + 4;
    } while (99999 < uVar8);
    uVar15 = uVar15 + 1;
  }
LAB_001067dd:
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct
            ((ulong)local_90,(char)uVar15 - ((char)((ulong)local_1d8 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_90[0] + (uVar13 >> 0x1f),uVar15,uVar14);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_90);
  local_188 = (ulong *)*plVar4;
  puVar11 = (ulong *)(plVar4 + 2);
  if (local_188 == puVar11) {
    local_178 = *puVar11;
    lStack_170 = plVar4[3];
    local_188 = &local_178;
  }
  else {
    local_178 = *puVar11;
  }
  local_180 = plVar4[1];
  *plVar4 = (long)puVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar14 = 1;
  if (9 < (uint)nfiles) {
    uVar13 = 4;
    uVar15 = nfiles;
    do {
      uVar14 = uVar13;
      if (uVar15 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_001068cc;
      }
      if (uVar15 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_001068cc;
      }
      if (uVar15 < 10000) goto LAB_001068cc;
      bVar17 = 99999 < uVar15;
      uVar13 = uVar14 + 4;
      uVar15 = uVar15 / 10000;
    } while (bVar17);
    uVar14 = uVar14 + 1;
  }
LAB_001068cc:
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct((ulong)&local_1a8,(char)uVar14);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a8,uVar14,nfiles);
  uVar9 = 0xf;
  if (local_188 != &local_178) {
    uVar9 = local_178;
  }
  if (uVar9 < (ulong)(local_1a0 + local_180)) {
    uVar9 = 0xf;
    if (local_1a8 != local_198) {
      uVar9 = local_198[0];
    }
    if (uVar9 < (ulong)(local_1a0 + local_180)) goto LAB_0010694d;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_188);
  }
  else {
LAB_0010694d:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1a8);
  }
  local_158 = (undefined8 *)*puVar7;
  puVar1 = puVar7 + 2;
  if (local_158 == puVar1) {
    local_148 = *puVar1;
    uStack_140 = puVar7[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar1;
  }
  local_150 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
  local_f8 = (ulong *)*plVar4;
  puVar11 = (ulong *)(plVar4 + 2);
  if (local_f8 == puVar11) {
    local_e8 = *puVar11;
    lStack_e0 = plVar4[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar11;
  }
  local_f0 = plVar4[1];
  *plVar4 = (long)puVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar14 = -writers;
  if (0 < writers) {
    uVar14 = writers;
  }
  uVar13 = 1;
  if (9 < uVar14) {
    uVar9 = (ulong)uVar14;
    uVar15 = 4;
    do {
      uVar13 = uVar15;
      uVar3 = (uint)uVar9;
      if (uVar3 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_00106a89;
      }
      if (uVar3 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_00106a89;
      }
      if (uVar3 < 10000) goto LAB_00106a89;
      uVar9 = uVar9 / 10000;
      uVar15 = uVar13 + 4;
    } while (99999 < uVar3);
    uVar13 = uVar13 + 1;
  }
LAB_00106a89:
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,(char)uVar13 - (char)(writers >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)writers >> 0x1f) + (long)local_1c8),uVar13,uVar14);
  uVar9 = 0xf;
  if (local_f8 != &local_e8) {
    uVar9 = local_e8;
  }
  if (uVar9 < (ulong)(local_1c0 + local_f0)) {
    uVar9 = 0xf;
    if (local_1c8 != local_1b8) {
      uVar9 = local_1b8[0];
    }
    if (uVar9 < (ulong)(local_1c0 + local_f0)) goto LAB_00106b06;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_f8);
  }
  else {
LAB_00106b06:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_1c8);
  }
  local_138 = (undefined8 *)*puVar7;
  puVar1 = puVar7 + 2;
  if (local_138 == puVar1) {
    local_128 = *puVar1;
    uStack_120 = puVar7[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *puVar1;
  }
  local_130 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
  local_d8 = (ulong *)*plVar4;
  puVar11 = (ulong *)(plVar4 + 2);
  if (local_d8 == puVar11) {
    local_c8 = *puVar11;
    lStack_c0 = plVar4[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar11;
  }
  local_d0 = plVar4[1];
  *plVar4 = (long)puVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar14 = -readers;
  if (0 < readers) {
    uVar14 = readers;
  }
  uVar13 = 1;
  if (9 < uVar14) {
    uVar9 = (ulong)uVar14;
    uVar15 = 4;
    do {
      uVar13 = uVar15;
      uVar3 = (uint)uVar9;
      if (uVar3 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_00106c41;
      }
      if (uVar3 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_00106c41;
      }
      if (uVar3 < 10000) goto LAB_00106c41;
      uVar9 = uVar9 / 10000;
      uVar15 = uVar13 + 4;
    } while (99999 < uVar3);
    uVar13 = uVar13 + 1;
  }
LAB_00106c41:
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar13 - (char)(readers >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)readers >> 0x1f) + (long)local_118),uVar13,uVar14);
  uVar9 = 0xf;
  if (local_d8 != &local_c8) {
    uVar9 = local_c8;
  }
  if (uVar9 < (ulong)(local_110 + local_d0)) {
    uVar9 = 0xf;
    if (local_118 != local_108) {
      uVar9 = local_108[0];
    }
    if (uVar9 < (ulong)(local_110 + local_d0)) goto LAB_00106cd5;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_00106cd5:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_118);
  }
  local_220 = (char *)*puVar7;
  pcVar2 = (char *)(puVar7 + 2);
  if (local_220 == pcVar2) {
    local_210 = *(undefined8 *)pcVar2;
    uStack_208 = puVar7[3];
    local_220 = (char *)&local_210;
  }
  else {
    local_210 = *(undefined8 *)pcVar2;
  }
  local_218 = puVar7[1];
  *puVar7 = pcVar2;
  puVar7[1] = 0;
  *pcVar2 = '\0';
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
  local_200._M_dataplus._M_p = (pointer)*puVar7;
  psVar10 = puVar7 + 2;
  if ((size_type *)local_200._M_dataplus._M_p == psVar10) {
    local_200.field_2._M_allocated_capacity = *psVar10;
    local_200.field_2._8_8_ = puVar7[3];
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar10;
  }
  local_200._M_string_length = puVar7[1];
  *puVar7 = psVar10;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  if (local_220 != (char *)&local_210) {
    operator_delete(local_220);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  pSVar5 = local_98;
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  std::__cxx11::string::append((char *)&local_200);
  this = (pSVar5->super_FileHandlePool).sa;
  if (this != (StatAggregator *)0x0) {
    StatAggregator::aggregateAndPrintStats
              (this,local_200._M_dataplus._M_p,(pSVar5->super_FileHandlePool).samples,"ms");
  }
  (*(pSVar5->super_FileHandlePool)._vptr_FileHandlePool[1])(pSVar5);
  fdb_shutdown();
  system("rm -rf  usecase_test* > errorlog.txt");
  memleak_end();
  test_readers_writers_with_handle_pool();
LAB_00106ef0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void test_readers_writers_with_handle_pool(int nhandles,
                                           int nfiles,
                                           int writers,
                                           int readers,
                                           bool useSnapHandlePool,
                                           int time) {
    TEST_INIT();
    memleak_start();

    int r;

    r = system(SHELL_DEL" usecase_test* > errorlog.txt");
    (void)r;

    if (nfiles < 1) {
        fprintf(stderr, "[ERROR] Invalid number of files: %d!", nfiles);
        return;
    }

    // Set filename(s)
    std::vector<std::string> files;
    for (int i = 1; i <= nfiles; ++i) {
        std::string filename("./usecase_test" + std::to_string(i));
        files.push_back(filename);
    }

    if (writers + readers < 1) {
        fprintf(stderr, "[ERROR] Invalid number of readers (%d)/writers (%d)!",
                readers, writers);
        return;
    }

    // Prepare handle pool
    FileHandlePool *hp;
    if (!useSnapHandlePool) {
        hp = new FileHandlePool(files, nhandles);
    } else {
        hp = new SnapHandlePool(files, nhandles);
    }

    thread_t *threads = new thread_t[writers + readers];

    struct ops_args oa{hp, (float)time, useSnapHandlePool};

    int threadid = 0;
    // Spawn writer thread(s)
    for (int i = 0; i < writers; ++i) {
        thread_create(&threads[threadid++], invoke_writer_ops, &oa);
    }

    // Spawn reader thread(s)
    for (int i = 0; i < readers; ++i) {
        thread_create(&threads[threadid++], invoke_reader_ops, &oa);
    }

    assert(threadid == readers + writers);

    // Wait for child threads
    for (int j = 0; j < (readers + writers); ++j) {
        int r = thread_join(threads[j], nullptr);
        assert(r == 0);
    }
    delete[] threads;

    std::string test_title(std::to_string(nhandles) + "H, " +
                           std::to_string(nfiles) + "F, " +
                           std::to_string(writers) + "RW, " +
                           std::to_string(readers) + "RO - ");
    test_title += useSnapHandlePool ? "Seperate Pool test" : "Shared Pool test";

    /* Print Collected Stats */
    hp->displayCollection(test_title.c_str());

#ifdef __DEBUG_USECASE
    hp->printHandleStats();
#endif

    /* cleanup */
    delete hp;

    /* shutdown */
    fdb_shutdown();

#ifndef __DEBUG_USECASE
    r = system(SHELL_DEL" usecase_test* > errorlog.txt");
    (void)r;
#endif

    memleak_end();
    TEST_RESULT(test_title.c_str());
}